

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O0

void alex::fanout_tree::collect_used_nodes
               (vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                *fanout_tree,int max_level,
               vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               *used_fanout_tree_nodes)

{
  bool bVar1;
  size_type sVar2;
  int *piVar3;
  iterator __comp;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  *in_RDI;
  FTNode *tree_node;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  value_type *level;
  int i;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  *in_stack_ffffffffffffffa0;
  value_type *in_stack_ffffffffffffffa8;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  __normal_iterator<const_alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  local_38;
  const_reference local_30;
  const_reference local_28;
  int local_20;
  int local_1c [4];
  int local_c;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  *local_8;
  
  local_8 = in_RDI;
  sVar2 = std::
          vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
          ::size(in_RDI);
  local_1c[0] = (int)sVar2 + -1;
  piVar3 = std::min<int>(&local_c,local_1c);
  local_c = *piVar3;
  for (local_20 = 0; local_20 <= local_c; local_20 = local_20 + 1) {
    local_30 = std::
               vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ::operator[](local_8,(long)local_20);
    local_28 = local_30;
    local_38._M_current =
         (FTNode *)
         std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::begin
                   (in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffc0 =
         std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::end
                   (in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffa0,
                         (__normal_iterator<const_alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      in_stack_ffffffffffffffb8._M_current =
           __gnu_cxx::
           __normal_iterator<const_alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
           ::operator*(&local_38);
      if (((in_stack_ffffffffffffffb8._M_current)->use & 1U) != 0) {
        std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
        push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      __gnu_cxx::
      __normal_iterator<const_alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
      ::operator++(&local_38);
    }
  }
  __comp = std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::begin
                     (in_stack_ffffffffffffff98);
  std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::end
            (in_stack_ffffffffffffff98);
  std::
  sort<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>
            ((__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
              )in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8,
             (anon_class_8_1_07378f89)__comp._M_current);
  return;
}

Assistant:

inline void collect_used_nodes(const std::vector<std::vector<FTNode>>& fanout_tree,
                        int max_level,
                        std::vector<FTNode>& used_fanout_tree_nodes) {
  max_level = std::min(max_level, static_cast<int>(fanout_tree.size()) - 1);
  for (int i = 0; i <= max_level; i++) {
    auto& level = fanout_tree[i];
    for (const FTNode& tree_node : level) {
      if (tree_node.use) {
        used_fanout_tree_nodes.push_back(tree_node);
      }
    }
  }
  std::sort(used_fanout_tree_nodes.begin(), used_fanout_tree_nodes.end(),
            [&](FTNode& left, FTNode& right) {
              // this is better than comparing boundary locations
              return (left.node_id << (max_level - left.level)) <
                     (right.node_id << (max_level - right.level));
            });
}